

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O0

int Map_MappingGetMaxLevel(Map_Man_t *pMan)

{
  uint local_1c;
  int local_18;
  uint local_14;
  int i;
  int nLevelMax;
  Map_Man_t *pMan_local;
  
  local_14 = 0;
  for (local_18 = 0; local_18 < pMan->nOutputs; local_18 = local_18 + 1) {
    if ((*(uint *)(((ulong)pMan->pOutputs[local_18] & 0xfffffffffffffffe) + 0x1c) >> 5 & 0xffff) <
        local_14) {
      local_1c = local_14;
    }
    else {
      local_1c = *(uint *)(((ulong)pMan->pOutputs[local_18] & 0xfffffffffffffffe) + 0x1c) >> 5 &
                 0xffff;
    }
    local_14 = local_1c;
  }
  return local_14;
}

Assistant:

int Map_MappingGetMaxLevel( Map_Man_t * pMan )
{
    int nLevelMax, i;
    nLevelMax = 0;
    for ( i = 0; i < pMan->nOutputs; i++ )
        nLevelMax = ((unsigned)nLevelMax) > Map_Regular(pMan->pOutputs[i])->Level? 
                nLevelMax : Map_Regular(pMan->pOutputs[i])->Level;
    return nLevelMax;
}